

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9VmInstallForeignFunction
                (jx9_vm *pVm,SyString *pName,ProcHostFunction xFunc,void *pUserData)

{
  void *pvVar1;
  bool bVar2;
  SyHashEntry_Pr *pSVar3;
  undefined8 *pChunk;
  char *pcVar4;
  sxi32 sVar5;
  
  pSVar3 = (SyHashEntry_Pr *)0x0;
  if ((pName->nByte != 0) && ((pVm->hHostFunction).nEntry != 0)) {
    pSVar3 = HashGetEntry(&pVm->hHostFunction,pName->zString,pName->nByte);
  }
  if (pSVar3 != (SyHashEntry_Pr *)0x0) {
    pvVar1 = pSVar3->pUserData;
    *(void **)((long)pvVar1 + 0x20) = pUserData;
    *(ProcHostFunction *)((long)pvVar1 + 0x18) = xFunc;
    *(undefined4 *)((long)pvVar1 + 0x38) = 0;
    *(undefined4 *)((long)pvVar1 + 0x44) = 0;
    return 0;
  }
  pChunk = (undefined8 *)SyMemBackendPoolAlloc(&pVm->sAllocator,0x50);
  sVar5 = -1;
  if (pChunk != (undefined8 *)0x0) {
    pcVar4 = SyMemBackendStrDup(&pVm->sAllocator,pName->zString,pName->nByte);
    if (pcVar4 != (char *)0x0) {
      *pChunk = 0;
      pChunk[1] = 0;
      pChunk[8] = 0;
      pChunk[9] = 0;
      pChunk[6] = 0;
      pChunk[7] = 0;
      pChunk[4] = 0;
      pChunk[5] = 0;
      pChunk[2] = 0;
      pChunk[3] = 0;
      pChunk[1] = pcVar4;
      *(uint *)(pChunk + 2) = pName->nByte;
      *pChunk = pVm;
      pChunk[3] = xFunc;
      pChunk[4] = pUserData;
      pChunk[8] = 8;
      pChunk[5] = pVm;
      pChunk[6] = 0;
      pChunk[7] = 0;
      pChunk[9] = 0;
      sVar5 = 0;
      bVar2 = true;
      goto LAB_0010c541;
    }
    SyMemBackendPoolFree(&pVm->sAllocator,pChunk);
  }
  bVar2 = false;
LAB_0010c541:
  if (bVar2) {
    sVar5 = SyHashInsert(&pVm->hHostFunction,(void *)pChunk[1],pName->nByte,pChunk);
    if (sVar5 == 0) {
      sVar5 = 0;
    }
    else {
      SyMemBackendFree(&pVm->sAllocator,(void *)pChunk[1]);
      SyMemBackendPoolFree(&pVm->sAllocator,pChunk);
      sVar5 = -1;
    }
  }
  return sVar5;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmInstallForeignFunction(
	jx9_vm *pVm,              /* Target VM */
	const SyString *pName,    /* Foreign function name */
	ProcHostFunction xFunc,  /* Foreign function implementation */
	void *pUserData           /* Foreign function private data */
	)
{
	jx9_user_func *pFunc;
	SyHashEntry *pEntry;
	sxi32 rc;
	/* Overwrite any previously registered function with the same name */
	pEntry = SyHashGet(&pVm->hHostFunction, pName->zString, pName->nByte);
	if( pEntry ){
		pFunc = (jx9_user_func *)pEntry->pUserData;
		pFunc->pUserData = pUserData;
		pFunc->xFunc = xFunc;
		SySetReset(&pFunc->aAux);
		return SXRET_OK;
	}
	/* Create a new user function */
	rc = jx9NewForeignFunction(&(*pVm), &(*pName), xFunc, pUserData, &pFunc);
	if( rc != SXRET_OK ){
		return rc;
	}
	/* Install the function in the corresponding hashtable */
	rc = SyHashInsert(&pVm->hHostFunction, SyStringData(&pFunc->sName), pName->nByte, pFunc);
	if( rc != SXRET_OK ){
		SyMemBackendFree(&pVm->sAllocator, (void *)SyStringData(&pFunc->sName));
		SyMemBackendPoolFree(&pVm->sAllocator, pFunc);
		return rc;
	}
	/* User function successfully installed */
	return SXRET_OK;
}